

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_type __thiscall llvm::StringRef::find_last_not_of(StringRef *this,StringRef Chars,size_t From)

{
  byte bVar1;
  bool bVar2;
  size_type i;
  size_t Index;
  size_type e;
  ulong uVar3;
  bitset<256UL> CharBits;
  StringRef Chars_local;
  
  Chars_local.Data = Chars.Data;
  CharBits.super__Base_bitset<4UL>._M_w[2] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[3] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[0] = 0;
  CharBits.super__Base_bitset<4UL>._M_w[1] = 0;
  Chars_local.Length = Chars.Length;
  for (Index = 0; Chars.Length != Index; Index = Index + 1) {
    bVar1 = operator[](&Chars_local,Index);
    std::bitset<256UL>::set(&CharBits,(ulong)bVar1,true);
  }
  if (this->Length < From) {
    From = this->Length;
  }
  do {
    uVar3 = From - 1;
    if (From == 0) {
      return 0xffffffffffffffff;
    }
    bVar2 = std::bitset<256UL>::test(&CharBits,(ulong)(byte)this->Data[From - 1]);
    From = uVar3;
  } while (bVar2);
  return uVar3;
}

Assistant:

StringRef::size_type StringRef::find_last_not_of(StringRef Chars,
                                                 size_t From) const {
  std::bitset<1 << CHAR_BIT> CharBits;
  for (size_type i = 0, e = Chars.size(); i != e; ++i)
    CharBits.set((unsigned char)Chars[i]);

  for (size_type i = std::min(From, Length) - 1, e = -1; i != e; --i)
    if (!CharBits.test((unsigned char)Data[i]))
      return i;
  return npos;
}